

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O3

void __thiscall Simulator::compare_not_equal(Simulator *this,PCode *code)

{
  deque<StackSymbol,_std::allocator<StackSymbol>_> *this_00;
  _Elt_pointer pSVar1;
  StackSymbol left;
  StackSymbol right;
  StackSymbol local_f0;
  Type local_a8;
  int local_a0;
  vector<int,_std::allocator<int>_> local_98;
  double local_80;
  vector<double,_std::allocator<double>_> local_78;
  Type local_60;
  int local_58;
  vector<int,_std::allocator<int>_> local_50;
  double local_38;
  vector<double,_std::allocator<double>_> local_30;
  
  pSVar1 = (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pSVar1 == (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    pSVar1 = (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 7;
  }
  local_60 = pSVar1[-1].type_;
  local_58 = pSVar1[-1].value_.int_value;
  std::vector<int,_std::allocator<int>_>::vector(&local_50,&pSVar1[-1].value_.int_array);
  local_38 = pSVar1[-1].value_.real_value;
  std::vector<double,_std::allocator<double>_>::vector(&local_30,&pSVar1[-1].value_.real_array);
  this_00 = &this->stack_;
  std::deque<StackSymbol,_std::allocator<StackSymbol>_>::pop_back(this_00);
  pSVar1 = (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pSVar1 == (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    pSVar1 = (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 7;
  }
  local_a8 = pSVar1[-1].type_;
  local_a0 = pSVar1[-1].value_.int_value;
  std::vector<int,_std::allocator<int>_>::vector(&local_98,&pSVar1[-1].value_.int_array);
  local_80 = pSVar1[-1].value_.real_value;
  std::vector<double,_std::allocator<double>_>::vector(&local_78,&pSVar1[-1].value_.real_array);
  std::deque<StackSymbol,_std::allocator<StackSymbol>_>::pop_back(this_00);
  if (local_a8 == kInt) {
    if (local_60 == kInt) {
      local_f0.type_ = kInt;
      local_f0.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_f0.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_f0.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_f0.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_f0.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_f0.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_f0.value_.int_value = (int)(local_a0 != local_58);
      std::deque<StackSymbol,_std::allocator<StackSymbol>_>::emplace_back<StackSymbol>
                (this_00,&local_f0);
    }
    else {
      local_f0.value_.int_value = -(uint)((double)local_a0 != local_38) & 1;
      local_f0.type_ = kInt;
      local_f0.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_f0.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_f0.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_f0.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_f0.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_f0.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::deque<StackSymbol,_std::allocator<StackSymbol>_>::emplace_back<StackSymbol>
                (this_00,&local_f0);
    }
  }
  else if (local_60 == kInt) {
    local_f0.value_.int_value = -(uint)((double)local_58 != local_80) & 1;
    local_f0.type_ = kInt;
    local_f0.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_f0.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f0.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_f0.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_f0.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f0.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::deque<StackSymbol,_std::allocator<StackSymbol>_>::emplace_back<StackSymbol>
              (this_00,&local_f0);
  }
  else {
    local_f0.value_.int_value = -(uint)(local_38 != local_80) & 1;
    local_f0.type_ = kInt;
    local_f0.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_f0.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f0.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_f0.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_f0.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f0.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::deque<StackSymbol,_std::allocator<StackSymbol>_>::emplace_back<StackSymbol>
              (this_00,&local_f0);
  }
  if (local_f0.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.value_.real_array.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f0.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  this->eip_ = this->eip_ + 1;
  if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Simulator::compare_not_equal(const PCode &code) {
    StackSymbol right = stack_.back();
    stack_.pop_back();
    StackSymbol left = stack_.back();
    stack_.pop_back();

    if (left.type() == StackSymbol::Type::kInt) {
        if (right.type() == StackSymbol::Type::kInt) {
            stack_.push_back(StackSymbol((int)(left.int_value() != right.int_value())));
        } else {
            stack_.push_back(StackSymbol((int)((double)left.int_value() != right.real_value())));
        }
    } else {
        if (right.type() == StackSymbol::Type::kInt) {
            stack_.push_back(StackSymbol((int)(left.real_value() != (double)right.int_value())));
        } else {
            stack_.push_back(StackSymbol((int)(left.real_value() != right.real_value())));
        }
    }

    inc_eip();
}